

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

double hungarian_algorithm::
       solve<double,unsigned_long,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<double>>
                 (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *cost_function,unsigned_long num_rows,unsigned_long num_cols,
                 vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map,
                 less<double> *cost_comparator)

{
  double dVar1;
  HungarianSolver<double,_unsigned_long,_std::less<double>_> solver;
  double local_120;
  HungarianSolver<double,_unsigned_long,_std::less<double>_> local_118;
  
  local_120 = 0.0;
  HungarianSolver<double,_unsigned_long,_std::less<double>_>::HungarianSolver
            (&local_118,num_rows,num_cols,cost_comparator,&local_120);
  HungarianSolver<double,unsigned_long,std::less<double>>::
  solve<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            ((HungarianSolver<double,unsigned_long,std::less<double>> *)&local_118,cost_function);
  dVar1 = HungarianSolver<double,unsigned_long,std::less<double>>::
          getAssignment<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((HungarianSolver<double,unsigned_long,std::less<double>> *)&local_118,
                     cost_function,assignment_map);
  HungarianSolver<double,_unsigned_long,_std::less<double>_>::~HungarianSolver(&local_118);
  return dVar1;
}

Assistant:

Cost solve(const CostFunction& cost_function, const Size num_rows, const Size num_cols, AssignmentMap& assignment_map,
           const CostComparator& cost_comparator)
{
  HungarianSolver<Cost, Size, CostComparator> solver(num_rows, num_cols, cost_comparator, Cost());
  solver.solve(cost_function);
  return solver.getAssignment(cost_function, assignment_map);
}